

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pageFreeArray(MemPage *pPg,int iFirst,int nCell,CellArray *pCArray)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int sz;
  u8 *pCell;
  int szFree;
  u8 *pFree;
  int iEnd;
  int i;
  int nRet;
  u8 *pStart;
  u8 *pEnd;
  u8 *aData;
  u16 iSize;
  ulong uVar8;
  u16 iStart;
  undefined4 in_stack_ffffffffffffffb8;
  int local_40;
  int local_3c;
  
  lVar3 = *(long *)(in_RDI + 0x50);
  uVar7 = lVar3 + (ulong)*(uint *)(*(long *)(in_RDI + 0x48) + 0x34);
  bVar1 = *(byte *)(in_RDI + 9);
  bVar2 = *(byte *)(in_RDI + 10);
  local_3c = 0;
  iVar5 = in_ESI + in_EDX;
  uVar8 = 0;
  local_40 = in_ESI;
  do {
    iSize = (u16)(uVar8 >> 0x20);
    iStart = (u16)(uVar8 >> 0x30);
    if (iVar5 <= local_40) {
      if (uVar8 != 0) {
        freeSpace((MemPage *)CONCAT44(iVar5,in_stack_ffffffffffffffb8),iStart,iSize);
      }
      return local_3c;
    }
    uVar4 = *(ulong *)(*(long *)(in_RCX + 0x10) + (long)local_40 * 8);
    if (((ulong)(lVar3 + (int)(bVar1 + 8 + (uint)bVar2)) <= uVar4) && (uVar4 < uVar7)) {
      uVar6 = (uint)*(ushort *)(*(long *)(in_RCX + 0x18) + (long)local_40 * 2);
      if (uVar8 != uVar4 + (long)(int)uVar6) {
        if (uVar8 != 0) {
          freeSpace((MemPage *)CONCAT44(iVar5,in_stack_ffffffffffffffb8),iStart,iSize);
        }
        if (uVar7 < uVar4 + (long)(int)uVar6) {
          return 0;
        }
      }
      local_3c = local_3c + 1;
      uVar8 = uVar4;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

static int pageFreeArray(
  MemPage *pPg,                   /* Page to edit */
  int iFirst,                     /* First cell to delete */
  int nCell,                      /* Cells to delete */
  CellArray *pCArray              /* Array of cells */
){
  u8 * const aData = pPg->aData;
  u8 * const pEnd = &aData[pPg->pBt->usableSize];
  u8 * const pStart = &aData[pPg->hdrOffset + 8 + pPg->childPtrSize];
  int nRet = 0;
  int i;
  int iEnd = iFirst + nCell;
  u8 *pFree = 0;
  int szFree = 0;

  for(i=iFirst; i<iEnd; i++){
    u8 *pCell = pCArray->apCell[i];
    if( SQLITE_WITHIN(pCell, pStart, pEnd) ){
      int sz;
      /* No need to use cachedCellSize() here.  The sizes of all cells that
      ** are to be freed have already been computing while deciding which
      ** cells need freeing */
      sz = pCArray->szCell[i];  assert( sz>0 );
      if( pFree!=(pCell + sz) ){
        if( pFree ){
          assert( pFree>aData && (pFree - aData)<65536 );
          freeSpace(pPg, (u16)(pFree - aData), szFree);
        }
        pFree = pCell;
        szFree = sz;
        if( pFree+sz>pEnd ) return 0;
      }else{
        pFree = pCell;
        szFree += sz;
      }
      nRet++;
    }
  }
  if( pFree ){
    assert( pFree>aData && (pFree - aData)<65536 );
    freeSpace(pPg, (u16)(pFree - aData), szFree);
  }
  return nRet;
}